

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.cpp
# Opt level: O2

void mpp_sthd_grp_start(MppSThdGrp grp)

{
  uint uVar1;
  undefined8 in_RAX;
  char *pcVar2;
  long lVar3;
  MppSThd thd;
  
  if (grp == (MppSThdGrp)0x0) {
    _mpp_log_l(2,"mpp_thread","Assertion %s failed at %s:%d\n",(char *)0x0,"impl",
               "mpp_sthd_grp_start",CONCAT44((int)((ulong)in_RAX >> 0x20),0x242));
    if ((mpp_debug._3_1_ & 0x10) != 0) {
      abort();
    }
  }
  pthread_mutex_lock((pthread_mutex_t *)((long)grp + 0x18));
  uVar1 = *(uint *)((long)grp + 0x14);
  if ((ulong)uVar1 == 1) {
    thd = (MppSThd)((long)grp + 0x40);
    for (lVar3 = 0; lVar3 < *(int *)((long)grp + 0x10); lVar3 = lVar3 + 1) {
      mpp_sthd_start(thd);
      thd = (MppSThd)((long)thd + 0x88);
    }
    *(undefined4 *)((long)grp + 0x14) = 2;
  }
  else {
    if ((int)uVar1 < 5) {
      pcVar2 = *(char **)(state2str(MppSThdStatus_e)::strof_sthd_status + (ulong)uVar1 * 8);
    }
    else {
      pcVar2 = "invalid";
    }
    _mpp_log_l(2,"mpp_thread","%s can NOT start on %s\n",(char *)0x0,grp,pcVar2);
  }
  pthread_mutex_unlock((pthread_mutex_t *)((long)grp + 0x18));
  return;
}

Assistant:

void mpp_sthd_grp_start(MppSThdGrp grp)
{
    MppSThdGrpImpl *impl = (MppSThdGrpImpl *)grp;
    MppSThdStatus status;

    mpp_assert(impl);

    /* we can only change callback function on uninit */
    pthread_mutex_lock(&impl->lock);
    status = impl->status;
    switch (status) {
    case MPP_STHD_READY : {
        RK_S32 i;

        for (i = 0; i < impl->count; i++)
            mpp_sthd_start(&impl->thds[i]);

        impl->status = MPP_STHD_RUNNING;
    } break;
    default : {
        mpp_err("%s can NOT start on %s\n", impl->name, state2str(status));
    } break;
    }
    pthread_mutex_unlock(&impl->lock);
}